

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_window_quantiles.cc
# Opt level: O2

CKMSQuantiles * __thiscall
prometheus::detail::TimeWindowQuantiles::rotate(TimeWindowQuantiles *this)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  CKMSQuantiles *this_00;
  
  lVar1 = std::chrono::_V2::steady_clock::now();
  lVar2 = (this->rotation_interval_).__r;
  for (lVar1 = lVar1 - (this->last_rotation_).__d.__r;
      this_00 = (this->ckms_quantiles_).
                super__Vector_base<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
                ._M_impl.super__Vector_impl_data._M_start + this->current_bucket_, lVar2 < lVar1;
      lVar1 = lVar1 - lVar2) {
    CKMSQuantiles::reset(this_00);
    uVar3 = this->current_bucket_ + 1;
    if ((ulong)(((long)(this->ckms_quantiles_).
                       super__Vector_base<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->ckms_quantiles_).
                      super__Vector_base<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0xfd0) <= uVar3) {
      uVar3 = 0;
    }
    this->current_bucket_ = uVar3;
    lVar2 = (this->rotation_interval_).__r;
    (this->last_rotation_).__d.__r = (this->last_rotation_).__d.__r + lVar2;
  }
  return this_00;
}

Assistant:

CKMSQuantiles& TimeWindowQuantiles::rotate() const {
  auto delta = Clock::now() - last_rotation_;
  while (delta > rotation_interval_) {
    ckms_quantiles_[current_bucket_].reset();

    if (++current_bucket_ >= ckms_quantiles_.size()) {
      current_bucket_ = 0;
    }

    delta -= rotation_interval_;
    last_rotation_ += rotation_interval_;
  }
  return ckms_quantiles_[current_bucket_];
}